

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::CooperativeMatrixNV::IsSameImpl
          (CooperativeMatrixNV *this,Type *that,IsSameCache *seen)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  bool local_39;
  CooperativeMatrixNV *mt;
  IsSameCache *seen_local;
  Type *that_local;
  CooperativeMatrixNV *this_local;
  long lVar3;
  
  iVar1 = (*that->_vptr_Type[0x38])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (lVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = (*this->component_type_->_vptr_Type[2])
                      (this->component_type_,*(undefined8 *)(lVar3 + 0x28),seen);
    local_39 = false;
    if (((((uVar2 & 1) != 0) && (local_39 = false, this->scope_id_ == *(uint32_t *)(lVar3 + 0x30)))
        && (local_39 = false, this->rows_id_ == *(uint32_t *)(lVar3 + 0x34))) &&
       (local_39 = false, this->columns_id_ == *(uint32_t *)(lVar3 + 0x38))) {
      local_39 = analysis::Type::HasSameDecorations(&this->super_Type,that);
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool CooperativeMatrixNV::IsSameImpl(const Type* that,
                                     IsSameCache* seen) const {
  const CooperativeMatrixNV* mt = that->AsCooperativeMatrixNV();
  if (!mt) return false;
  return component_type_->IsSameImpl(mt->component_type_, seen) &&
         scope_id_ == mt->scope_id_ && rows_id_ == mt->rows_id_ &&
         columns_id_ == mt->columns_id_ && HasSameDecorations(that);
}